

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chvalid.c
# Opt level: O0

int xmlCharInRange(uint val,xmlChRangeGroup *rptr)

{
  int iVar1;
  xmlChLRange *lptr;
  xmlChSRange *sptr;
  int local_20;
  int mid;
  int high;
  int low;
  xmlChRangeGroup *rptr_local;
  uint val_local;
  
  if (rptr != (xmlChRangeGroup *)0x0) {
    if (val < 0x10000) {
      if (rptr->nbShortRange == 0) {
        return 0;
      }
      mid = 0;
      local_20 = rptr->nbShortRange + -1;
      while (mid <= local_20) {
        iVar1 = (mid + local_20) / 2;
        if ((val & 0xffff) < (uint)rptr->shortRange[iVar1].low) {
          local_20 = iVar1 + -1;
        }
        else {
          if ((val & 0xffff) <= (uint)rptr->shortRange[iVar1].high) {
            return 1;
          }
          mid = iVar1 + 1;
        }
      }
    }
    else {
      if (rptr->nbLongRange == 0) {
        return 0;
      }
      mid = 0;
      local_20 = rptr->nbLongRange + -1;
      while (mid <= local_20) {
        iVar1 = (mid + local_20) / 2;
        if (val < rptr->longRange[iVar1].low) {
          local_20 = iVar1 + -1;
        }
        else {
          if (val <= rptr->longRange[iVar1].high) {
            return 1;
          }
          mid = iVar1 + 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

int
xmlCharInRange (unsigned int val, const xmlChRangeGroup *rptr) {
    int low, high, mid;
    const xmlChSRange *sptr;
    const xmlChLRange *lptr;

    if (rptr == NULL) return(0);
    if (val < 0x10000) {	/* is val in 'short' or 'long'  array? */
	if (rptr->nbShortRange == 0)
	    return 0;
	low = 0;
	high = rptr->nbShortRange - 1;
	sptr = rptr->shortRange;
	while (low <= high) {
	    mid = (low + high) / 2;
	    if ((unsigned short) val < sptr[mid].low) {
		high = mid - 1;
	    } else {
	        if ((unsigned short) val > sptr[mid].high) {
		    low = mid + 1;
		} else {
		    return 1;
		}
	    }
	}
    } else {
	if (rptr->nbLongRange == 0) {
	    return 0;
	}
	low = 0;
	high = rptr->nbLongRange - 1;
	lptr = rptr->longRange;
	while (low <= high) {
	    mid = (low + high) / 2;
	    if (val < lptr[mid].low) {
		high = mid - 1;
	    } else {
	        if (val > lptr[mid].high) {
		    low = mid + 1;
		} else {
		    return 1;
		}
	    }
	}
    }
    return 0;
}